

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O2

void visit_binary_expr(gvisitor_t *self,gnode_binary_expr_t *node)

{
  gnode_n gVar1;
  gnode_t *pgVar2;
  long *plVar3;
  int *piVar4;
  _Bool _Var5;
  long lVar6;
  gnode_binary_expr_t *expr;
  bool bVar7;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  gVar1 = node->left->tag;
  if (gVar1 != NODE_FLOW_STAT && 10 < gVar1 - NODE_BINARY_EXPR) {
    report_error(self,GRAVITY_ERROR_SEMANTIC,node->left,"LValue must be an expression.");
  }
  gVar1 = node->right->tag;
  if (gVar1 != NODE_FLOW_STAT && 10 < gVar1 - NODE_BINARY_EXPR) {
    report_error(self,GRAVITY_ERROR_SEMANTIC,node->right,"RValue must be an expression.");
  }
  gvisit(self,node->left);
  gvisit(self,node->right);
  pgVar2 = node->left;
  _Var5 = is_expression_valid(pgVar2);
  if (!_Var5) {
    report_error(self,GRAVITY_ERROR_SEMANTIC,pgVar2,"Invalid left expression.");
  }
  pgVar2 = node->right;
  _Var5 = is_expression_valid(pgVar2);
  if (!_Var5) {
    report_error(self,GRAVITY_ERROR_SEMANTIC,pgVar2,"Invalid right expression.");
  }
  if ((node->base).tag != NODE_BINARY_EXPR) {
    return;
  }
  if (node->op != TOK_OP_ASSIGN) {
    if (1 < node->op - TOK_OP_RANGE_EXCLUDED) {
      return;
    }
    local_28 = *(undefined4 *)&node->left;
    uStack_24 = *(undefined4 *)((long)&node->left + 4);
    uStack_20 = *(undefined4 *)&node->right;
    uStack_1c = *(undefined4 *)((long)&node->right + 4);
    lVar6 = 0;
    while( true ) {
      if (lVar6 == 2) {
        return;
      }
      if ((**(int **)(&local_28 + lVar6 * 2) == 0x11) &&
         ((*(int **)(&local_28 + lVar6 * 2))[0x12] != 2)) break;
      lVar6 = lVar6 + 1;
    }
    report_error(self,GRAVITY_ERROR_SEMANTIC,&node->base,"Range must be integer.");
    return;
  }
  pgVar2 = node->left;
  gVar1 = pgVar2->tag;
  if (gVar1 == NODE_FILE_EXPR) {
LAB_0011d3f7:
    pgVar2->is_assignment = true;
    return;
  }
  if (gVar1 == NODE_POSTFIX_EXPR) {
    if ((*(int **)(pgVar2 + 1) == (int *)0x0) || (**(int **)(pgVar2 + 1) != 0x11)) {
      plVar3 = *(long **)&pgVar2[1].block_length;
      if (plVar3 == (long *)0x0) {
        return;
      }
      if (*plVar3 == 0) {
        return;
      }
      piVar4 = *(int **)(plVar3[2] + -8 + *plVar3 * 8);
      if (piVar4 == (int *)0x0) {
        return;
      }
      bVar7 = *piVar4 != 0x15;
      pgVar2->is_assignment = bVar7;
      if (bVar7) {
        return;
      }
      goto LAB_0011d447;
    }
  }
  else if (gVar1 == NODE_IDENTIFIER_EXPR) goto LAB_0011d3f7;
  pgVar2->is_assignment = false;
LAB_0011d447:
  report_error(self,GRAVITY_ERROR_SEMANTIC,pgVar2,"Wrong assignment expression.");
  return;
}

Assistant:

static void visit_binary_expr (gvisitor_t *self, gnode_binary_expr_t *node) {
    DEBUG_CODEGEN("visit_binary_expr %s", token_name(node->op));
    DECLARE_CODE();

    // assignment is right associative
    if (node->op == TOK_OP_ASSIGN) {
        CODEGEN_COUNT_REGISTERS(n1);

        visit(node->right);
        visit(node->left);    // left expression can be: IDENTIFIER, FILE, POSTIFIX (not a call)

        CODEGEN_COUNT_REGISTERS(n2);
        CODEGEN_ASSERT_REGISTERS(n1, n2, 0);
        
        // Checkpoint added to support STRUCT
        ircode_add_check(code);
        return;
    }

    CODEGEN_COUNT_REGISTERS(n1);

    // visiting binary operation from left to right
    visit(node->left);
    visit(node->right);

    uint32_t r3 = ircode_register_pop(code);
    if (r3 == REGISTER_ERROR) report_error(self, (gnode_t *)node->right, "Invalid right expression.");
    uint32_t r2 = ircode_register_pop(code);
    if (r2 == REGISTER_ERROR) report_error(self, (gnode_t *)node->left, "Invalid left expression.");
    uint32_t r1 = ircode_register_push_temp(code);

    // a special instruction needs to be generated for a binary expression of type RANGE
    if ((node->op == TOK_OP_RANGE_INCLUDED) || (node->op == TOK_OP_RANGE_EXCLUDED)) {
		ircode_add_tag(code, RANGENEW, r1, r2, r3, (node->op == TOK_OP_RANGE_INCLUDED) ? RANGE_INCLUDE_TAG : RANGE_EXCLUDE_TAG, LINE_NUMBER(node));
        return;
    }

    // generate code for binary OP
    opcode_t op = token2opcode(node->op);
	ircode_add(code, op, r1, r2, r3, LINE_NUMBER(node));

    CODEGEN_COUNT_REGISTERS(n2);
    CODEGEN_ASSERT_REGISTERS(n1, n2, 1);
}